

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interprocedural.cpp
# Opt level: O0

void __thiscall
dg::pta::LLVMPointerGraphBuilder::addVariadicArgumentOperands
          (LLVMPointerGraphBuilder *this,Function *F,CallInst *CI,PSNode *arg)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  PSNode *in_RCX;
  CallInst *in_RDX;
  Function *in_RSI;
  uint idx;
  uint idx_00;
  
  sVar3 = llvm::Function::arg_size(in_RSI);
  uVar1 = (int)sVar3 - 1;
  while( true ) {
    idx_00 = uVar1;
    uVar2 = llvmutils::getNumArgOperands((CallInst *)0x1b1e36);
    if (uVar2 <= uVar1) break;
    addArgumentOperands((LLVMPointerGraphBuilder *)in_RSI,in_RDX,in_RCX,idx_00);
    uVar1 = idx_00 + 1;
  }
  return;
}

Assistant:

void LLVMPointerGraphBuilder::addVariadicArgumentOperands(
        const llvm::Function *F, const llvm::CallInst *CI, PSNode *arg) {
    for (unsigned idx = F->arg_size() - 1;
         idx < llvmutils::getNumArgOperands(CI); ++idx)
        addArgumentOperands(CI, arg, idx);
}